

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libskiwi.cpp
# Opt level: O0

void skiwi::skiwi_repl(int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  runtime_error *this;
  ulong uVar3;
  char *pcVar4;
  string local_130;
  undefined1 local_110 [8];
  string arg;
  string local_e8;
  undefined1 local_c8 [8];
  string command;
  char *pcStack_80;
  bool cmd;
  byte local_71;
  undefined1 local_70 [7];
  bool quit;
  string input;
  undefined1 local_48 [8];
  string filename;
  int i;
  char **argv_local;
  int argc_local;
  
  if (((anonymous_namespace)::cd[0] & 1) != 0) {
    for (filename.field_2._8_4_ = 1; (int)filename.field_2._8_4_ < argc;
        filename.field_2._8_4_ = filename.field_2._8_4_ + 1) {
      pcVar4 = argv[(int)filename.field_2._8_4_];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_48,pcVar4,(allocator<char> *)(input.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(input.field_2._M_local_buf + 0xf));
      skiwi_runf((string *)local_48);
      std::__cxx11::string::~string((string *)local_48);
    }
    (anonymous_namespace)::out<std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (anonymous_namespace)::welcome_message_abi_cxx11_);
    std::__cxx11::string::string((string *)local_70);
    local_71 = 0;
    while (((local_71 ^ 0xff) & 1) != 0) {
      pcStack_80 = (char *)std::__cxx11::string::c_str();
      (anonymous_namespace)::out<char_const*>(&stack0xffffffffffffff80);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,(string *)local_70);
      std::__cxx11::string::string((string *)(command.field_2._M_local_buf + 8),(string *)local_70);
      bVar2 = anon_unknown_1::is_cmd_command((string *)((long)&command.field_2 + 8));
      std::__cxx11::string::~string((string *)(command.field_2._M_local_buf + 8));
      if (bVar2) {
        std::__cxx11::string::string((string *)&local_e8,(string *)local_70);
        anon_unknown_1::get_cleaned_command((string *)local_c8,&local_e8);
        std::__cxx11::string::~string((string *)&local_e8);
        uVar3 = std::__cxx11::string::size();
        if (uVar3 < 2) {
          arg.field_2._12_4_ = 5;
        }
        else {
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_c8);
          cVar1 = *pcVar4;
          if (cVar1 == '?') {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_c8,",?");
            if (bVar2) {
              skiwi_show_help();
            }
          }
          else if (cVar1 == 'a') {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_c8,",asm");
            if (bVar2) {
              skiwi_show_assembly((string *)local_70);
            }
          }
          else if (cVar1 == 'e') {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_c8,",env");
            if (bVar2) {
              skiwi_show_environment();
            }
            else {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_c8,",exit");
              if (bVar2) {
                local_71 = 1;
              }
              else {
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_c8,",expand");
                if (bVar2) {
                  skiwi_show_expand((string *)local_70);
                }
                else {
                  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_c8,",external");
                  if (bVar2) {
                    std::__cxx11::string::string((string *)&local_130,(string *)local_70);
                    anon_unknown_1::get_cleaned_first_argument((string *)local_110,&local_130);
                    std::__cxx11::string::~string((string *)&local_130);
                    skiwi_show_external_primitives((string *)local_110);
                    std::__cxx11::string::~string((string *)local_110);
                  }
                }
              }
            }
          }
          else if (cVar1 == 'm') {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_c8,",mem");
            if (bVar2) {
              skiwi_show_memory();
            }
          }
          else if ((cVar1 == 'u') &&
                  (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_c8,",unresolved"), bVar2)) {
            skiwi_show_unresolved();
          }
          arg.field_2._12_4_ = 0;
        }
        std::__cxx11::string::~string((string *)local_c8);
      }
      else {
        uVar3 = std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          skiwi_run((string *)local_70);
        }
      }
    }
    std::__cxx11::string::~string((string *)local_70);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Skiwi is not initialized");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void skiwi_repl(int argc, char** argv)
  {
  using namespace SKIWI;
  if (!cd.initialized)
    throw std::runtime_error("Skiwi is not initialized");

  for (int i = 1; i < argc; ++i)
    {
    std::string filename(argv[i]);
    skiwi_runf(filename);
    }

  out(welcome_message);
  std::string input;
  bool quit = false;
  while (!quit)
    {
    out(prompt.c_str());

    std::getline(std::cin, input);

    bool cmd = is_cmd_command(input);
    if (cmd)
      {
      std::string command = get_cleaned_command(input);
      if (command.size() < 2)
        continue;
      switch (command[1])
        {
        case '?':
        {
        if (command == ",?")
          {
          skiwi_show_help();
          }
        break;
        }
        case 'a':
        {
        if (command == ",asm")
          {
          skiwi_show_assembly(input);
          }
        break;
        }
        case 'e':
        {
        if (command == ",env")
          {
          skiwi_show_environment();
          }
        else if (command == ",exit")
          {
          quit = true;
          }
        else if (command == ",expand")
          {
          skiwi_show_expand(input);
          }
        else if (command == ",external")
          {
          std::string arg = get_cleaned_first_argument(input);
          skiwi_show_external_primitives(arg);
          }
        break;
        }
        case 'm':
        {
        if (command == ",mem")
          {
          skiwi_show_memory();
          }
        break;
        }
        case 'u':
        {
        if (command == ",unresolved")
          {
          skiwi_show_unresolved();
          }
        break;
        }
        }
      }
    else if (!input.empty())
      {
      skiwi_run(input);
      }
    }
  }